

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

int cargo_add_mutex_group
              (cargo_t ctx,cargo_mutex_group_flags_t flags,char *name,char *title,char *description,
              ...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *d;
  va_list ap;
  char *title_00;
  __va_list_tag local_f8;
  undefined1 local_d8 [40];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  title_00 = (char *)0x0;
  local_b0 = in_R9;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1705,
                  "int cargo_add_mutex_group(cargo_t, cargo_mutex_group_flags_t, const char *, const char *, const char *, ...)"
                 );
  }
  if (description != (char *)0x0) {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &d;
    local_f8.gp_offset = 0x28;
    local_f8.fp_offset = 0x30;
    cargo_vasprintf((char **)&stack0xffffffffffffff00,description,&local_f8);
  }
  iVar1 = _cargo_add_group((cargo_t)&ctx->mutex_groups,(cargo_group_t **)&ctx->mutex_group_count,
                           &ctx->mutex_max_groups,(size_t *)(ulong)flags,(size_t)name,title,title_00
                           ,title_00);
  if (title_00 != (char *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(title_00);
    }
    else {
      (*replaced_cargo_free)(title_00);
    }
  }
  return iVar1;
}

Assistant:

int cargo_add_mutex_group(cargo_t ctx,
                        cargo_mutex_group_flags_t flags,
                        const char *name,
                        const char *title,
                        const char *description, ...)
{
    char *d = NULL;
    int ret = 0;
    va_list ap;
    assert(ctx);

    if (description)
    {
        va_start(ap, description);
        cargo_vasprintf(&d, description, ap);
        va_end(ap);
    }

    ret = _cargo_add_group(ctx, &ctx->mutex_groups, &ctx->mutex_group_count,
                            &ctx->mutex_max_groups,
                            (size_t)flags, name, title, d);
    _cargo_xfree(&d);
    return ret;
}